

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O3

void __thiscall BaseComponent::Subscribe(BaseComponent *this,Type type)

{
  pointer ppBVar1;
  int iVar2;
  mapped_type *pmVar3;
  __normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
  _Var4;
  vector<BaseComponent*,std::allocator<BaseComponent*>> *this_00;
  undefined8 uVar5;
  Type local_1c;
  BaseComponent *local_18;
  
  local_1c = type;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&eventsLock);
  if (iVar2 == 0) {
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_1c);
    ppBVar1 = (pmVar3->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_1c);
    local_18 = this;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<BaseComponent**,std::vector<BaseComponent*,std::allocator<BaseComponent*>>>,__gnu_cxx::__ops::_Iter_equals_val<BaseComponent*const>>
                      (ppBVar1,(pmVar3->
                               super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_1c);
    if (_Var4._M_current ==
        (pmVar3->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = (vector<BaseComponent*,std::allocator<BaseComponent*>> *)
                std::__detail::
                _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&events,&local_1c);
      local_18 = this;
      std::vector<BaseComponent*,std::allocator<BaseComponent*>>::emplace_back<BaseComponent*>
                (this_00,&local_18);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
    return;
  }
  uVar5 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
  _Unwind_Resume(uVar5);
}

Assistant:

void BaseComponent::Subscribe(Event::Type type) {
    std::lock_guard<std::mutex> lock(eventsLock);
    
    if(
        std::find(
            events[type].begin(), events[type].end(),
            this
        ) == events[type].end()
    ) {
        events[type].push_back(this);
    }
}